

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

bool __thiscall MetaCommand::Parse(MetaCommand *this,int argc,char **argv)

{
  string *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined4 extraout_var;
  size_t sVar5;
  Option *pOVar6;
  ostream *poVar7;
  pointer pFVar8;
  bool bVar9;
  undefined8 uVar10;
  long lVar11;
  pointer pOVar12;
  pointer pOVar13;
  uint uVar14;
  string *psVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  ulong local_2b0;
  long local_2a8;
  allocator local_283;
  allocator local_282;
  allocator local_281;
  ulong local_280;
  OptionVector *local_278;
  undefined8 local_270;
  string tag;
  string completeString;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  char optName [255];
  
  this_00 = &this->m_ExecutableName;
  std::__cxx11::string::assign((char *)this_00);
  lVar4 = std::__cxx11::string::find_last_of((char *)this_00,0x155501);
  if (lVar4 != 0) {
    std::__cxx11::string::substr((ulong)optName,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)optName);
    std::__cxx11::string::~string((string *)optName);
  }
  lVar4 = std::__cxx11::string::find_last_of((char *)this_00,0x163316);
  if (lVar4 != 0) {
    std::__cxx11::string::substr((ulong)optName,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)optName);
    std::__cxx11::string::~string((string *)optName);
  }
  if (argc == 2) {
    pcVar16 = argv[1];
    if (*pcVar16 == '-') {
      if (((pcVar16[1] == 'V') && (pcVar16[2] == '\0')) ||
         ((pcVar16[1] == 'H' && (pcVar16[2] == '\0')))) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Usage : ");
        poVar7 = std::operator<<(poVar7,*argv);
        std::endl<char,std::char_traits<char>>(poVar7);
        ListOptions(this);
        return false;
      }
      if (((pcVar16[1] == 'v') && (pcVar16[2] == '\0')) ||
         ((pcVar16[1] == 'h' && (pcVar16[2] == '\0')))) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Usage : ");
        poVar7 = std::operator<<(poVar7,*argv);
        std::endl<char,std::char_traits<char>>(poVar7);
        ListOptionsSimplified(this);
        return false;
      }
    }
    iVar2 = strcmp(pcVar16,"-vxml");
    if (iVar2 == 0) {
      ListOptionsXML(this);
      return false;
    }
    iVar2 = strcmp(pcVar16,"-version");
    if (iVar2 == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Version: ");
      pcVar16 = (this->m_Version)._M_dataplus._M_p;
LAB_001194ce:
      poVar7 = std::operator<<(poVar7,pcVar16);
      std::endl<char,std::char_traits<char>>(poVar7);
      return false;
    }
    iVar2 = strcmp(pcVar16,"-date");
    if (iVar2 == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Date: ");
      pcVar16 = (this->m_Date)._M_dataplus._M_p;
      goto LAB_001194ce;
    }
    iVar2 = strcmp(pcVar16,"-exportGAD");
    if (iVar2 == 0) {
      ExportGAD(this,false);
      return false;
    }
  }
  local_278 = &this->m_ParsedOptionVector;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear(local_278);
  std::__cxx11::string::string((string *)&tag,"",(allocator *)optName);
  std::__cxx11::string::string((string *)&completeString,"",(allocator *)optName);
  bVar1 = false;
  lVar4 = 0;
  local_2a8 = 0;
  local_2b0 = 0;
  local_280 = 0;
  local_270 = 0;
  for (uVar17 = 1; uVar17 < (uint)argc; uVar17 = uVar17 + 1) {
    pcVar16 = argv[uVar17];
    iVar2 = strcmp(pcVar16,"-exportGAD");
    if (iVar2 == 0) {
      local_270 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
    }
    else {
      if (*pcVar16 == '-') {
        dVar19 = atof(pcVar16);
        if (((dVar19 != 0.0) || (NAN(dVar19))) || (sVar5 = strlen(pcVar16), sVar5 < 2))
        goto LAB_00118c1e;
        if (local_2b0 != 0) {
          if ((local_280 & 1) == 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Found tag before end of value list!");
            std::endl<char,std::char_traits<char>>(poVar7);
            goto LAB_0011950d;
          }
          std::__cxx11::string::_M_assign
                    ((string *)
                     (*(long *)&(this->m_OptionVector).
                                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_2a8].fields.
                                super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                ._M_impl + 0x40));
          pOVar13 = (this->m_OptionVector).
                    super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          *(undefined1 *)
           (*(long *)&pOVar13[local_2a8].fields.
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl + 0xa9) = 1;
          pOVar13[local_2a8].userDefined = true;
          std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                    (local_278,pOVar13 + local_2a8);
        }
        std::__cxx11::string::assign((char *)&tag);
        std::__cxx11::string::string((string *)&local_178,(string *)&tag);
        bVar1 = OptionExistsByMinusTag(this,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_198,(string *)&tag);
          pOVar6 = GetOptionByMinusTag(this,&local_198);
          uVar10 = 0;
          local_2b0 = ((long)(pOVar6->fields).
                             super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pOVar6->fields).
                            super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xb0;
          std::__cxx11::string::~string((string *)&local_198);
          std::__cxx11::string::string((string *)&local_1b8,(string *)&tag);
          pOVar6 = GetOptionByMinusTag(this,&local_1b8);
          local_2a8 = GetOptionId(this,pOVar6);
          std::__cxx11::string::~string((string *)&local_1b8);
          if (local_2a8 < 0) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Error processing tag ");
            poVar7 = std::operator<<(poVar7,tag._M_dataplus._M_p);
            poVar7 = std::operator<<(poVar7,".  Tag exists but cannot find its Id.");
            bVar1 = true;
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          else {
            pOVar13 = (this->m_OptionVector).
                      super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_280 = CONCAT71((int7)((ulong)uVar10 >> 8),pOVar13[local_2a8].complete);
            lVar11 = *(long *)&pOVar13[local_2a8].fields.
                               super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ._M_impl;
            bVar1 = true;
            if (*(int *)(lVar11 + 0x60) == 4) {
              uVar3 = atoi(argv[(ulong)uVar17 + 1]);
              std::__cxx11::string::assign((char *)(lVar11 + 0x40));
              uVar17 = uVar17 + 1;
              local_2b0 = local_2b0 + (uVar3 - 1);
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                snprintf(optName,0xff,"%03u",(ulong)uVar14);
                std::__cxx11::string::string
                          ((string *)&local_1d8,
                           (string *)
                           ((this->m_OptionVector).
                            super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_2a8));
                std::__cxx11::string::string((string *)&local_1f8,optName,&local_281);
                std::__cxx11::string::string((string *)&local_218,"",&local_282);
                std::__cxx11::string::string((string *)&local_158,"",&local_283);
                AddOptionField(this,&local_1d8,&local_1f8,STRING,true,&local_218,&local_158,
                               DATA_NONE);
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_218);
                std::__cxx11::string::~string((string *)&local_1f8);
                std::__cxx11::string::~string((string *)&local_1d8);
              }
            }
            else if (*(int *)(lVar11 + 0x60) == 5) {
              std::__cxx11::string::assign((char *)(lVar11 + 0x40));
              bVar1 = false;
              local_2b0 = 0;
            }
          }
        }
        else {
          if (this->m_Verbose == true) {
            poVar7 = std::operator<<((ostream *)&std::cout,"The tag ");
            poVar7 = std::operator<<(poVar7,tag._M_dataplus._M_p);
            poVar7 = std::operator<<(poVar7," is not a valid argument : skipping this tag");
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          bVar1 = false;
        }
        uVar17 = uVar17 + bVar1;
      }
      else {
LAB_00118c1e:
        if (!bVar1) {
          lVar11 = 0;
          for (pOVar13 = (this->m_OptionVector).
                         super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar13 !=
              (this->m_OptionVector).
              super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
              super__Vector_impl_data._M_finish; pOVar13 = pOVar13 + 1) {
            if ((lVar4 <= lVar11) && ((pOVar13->tag)._M_string_length == 0)) {
              local_2b0 = ((long)(pOVar13->fields).
                                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pOVar13->fields).
                                super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0xb0 & 0xffffffff;
              local_2a8 = lVar11;
              goto LAB_00118ccc;
            }
            lVar11 = lVar11 + 1;
          }
          if (this->m_Verbose == true) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "Too many arguments specified in your command line! ");
            poVar7 = std::operator<<(poVar7,"Skipping extra argument: ");
            poVar7 = std::operator<<(poVar7,argv[uVar17]);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
LAB_00118ccc:
          lVar4 = local_2a8 + 1;
          bVar1 = true;
        }
      }
      if ((local_280 & 1) == 0) {
        if (((bVar1 != false) && (uVar17 < (uint)argc)) && (local_2b0 != 0)) {
          if ((-1 < local_2a8) &&
             (pOVar13 = (this->m_OptionVector).
                        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             local_2a8 <
             (int)((ulong)((long)(this->m_OptionVector).
                                 super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar13) >> 7)))
          {
            lVar11 = *(long *)&pOVar13[local_2a8].fields.
                               super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                               ._M_impl;
            lVar18 = (((long)*(pointer *)
                              ((long)&pOVar13[local_2a8].fields.
                                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                                      ._M_impl + 8) - lVar11) / 0xb0 - local_2b0) * 0xb0;
            std::__cxx11::string::assign((char *)(lVar11 + lVar18 + 0x40));
            *(undefined1 *)
             (*(long *)&(this->m_OptionVector).
                        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_2a8].fields.
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl + 0xa9 + lVar18) = 1;
          }
          local_2b0 = local_2b0 - 1;
        }
      }
      else if (completeString._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&completeString);
      }
      else {
        std::__cxx11::string::append((char *)&completeString);
        std::__cxx11::string::append((char *)&completeString);
      }
      if (local_2b0 == 0) {
        pOVar13 = (this->m_OptionVector).
                  super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pOVar13[local_2a8].userDefined = true;
        std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
                  (local_278,pOVar13 + local_2a8);
        bVar1 = false;
        local_2b0 = 0;
      }
    }
  }
  if (local_2b0 == 0) {
    bVar1 = false;
    for (pOVar13 = (this->m_OptionVector).
                   super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pOVar13 !=
        (this->m_OptionVector).
        super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
        super__Vector_impl_data._M_finish; pOVar13 = pOVar13 + 1) {
      if (pOVar13->required == true) {
        if (pOVar13->userDefined == false) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Option ");
          poVar7 = std::operator<<(poVar7,(string *)pOVar13);
          poVar7 = std::operator<<(poVar7," is required but not defined");
          bVar1 = true;
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        else {
          bVar9 = true;
          for (pFVar8 = (pOVar13->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pFVar8 != (pOVar13->fields).
                        super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pFVar8 = pFVar8 + 1) {
            bVar9 = (bool)(bVar9 & (pFVar8->value)._M_string_length != 0);
          }
          if (!bVar9) {
            if ((pOVar13->tag)._M_string_length == 0) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Field ");
              pOVar12 = pOVar13;
            }
            else {
              poVar7 = std::operator<<((ostream *)&std::cout,"Field ");
              pOVar12 = (pointer)&pOVar13->tag;
            }
            poVar7 = std::operator<<(poVar7,(pOVar12->name)._M_dataplus._M_p);
            poVar7 = std::operator<<(poVar7," is required but not defined");
            bVar1 = true;
            std::endl<char,std::char_traits<char>>(poVar7);
          }
        }
      }
    }
    if (bVar1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Command: ");
      poVar7 = std::operator<<(poVar7,*argv);
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"Options: ");
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"  -v or -h for help listed in short format");
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"  -V or -H for help listed in long format");
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"  -vxml for help listed in xml format");
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"  -export-gad to export Grid Application");
      poVar7 = std::operator<<(poVar7,"Description file format");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      bVar1 = true;
      for (pOVar13 = (this->m_ParsedOptionVector).
                     super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pOVar13 !=
          (this->m_ParsedOptionVector).
          super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
          super__Vector_impl_data._M_finish; pOVar13 = pOVar13 + 1) {
        for (psVar15 = (string *)
                       &((pOVar13->fields).
                         super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>
                         ._M_impl.super__Vector_impl_data._M_start)->rangeMin;
            (pointer)(psVar15 + -0x68) !=
            (pOVar13->fields).
            super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
            super__Vector_impl_data._M_finish; psVar15 = psVar15 + 0xb0) {
          if ((*(uint *)(psVar15 + -8) < 3) && (*(long *)(psVar15 + -0x20) != 0)) {
            if (*(long *)(psVar15 + 8) == 0) {
LAB_00119336:
              if (*(long *)(psVar15 + 0x28) != 0) {
                dVar19 = atof(*(char **)(psVar15 + 0x20));
                dVar20 = atof(*(char **)(psVar15 + -0x28));
                if (dVar19 < dVar20) goto LAB_00119365;
              }
            }
            else {
              dVar19 = atof(*(char **)psVar15);
              dVar20 = atof(*(char **)(psVar15 + -0x28));
              if (dVar19 <= dVar20) goto LAB_00119336;
LAB_00119365:
              poVar7 = std::operator<<((ostream *)&std::cout,(string *)pOVar13);
              poVar7 = std::operator<<(poVar7,".");
              poVar7 = std::operator<<(poVar7,psVar15 + -0x68);
              poVar7 = std::operator<<(poVar7," : Value (");
              poVar7 = std::operator<<(poVar7,psVar15 + -0x28);
              poVar7 = std::operator<<(poVar7,") ");
              poVar7 = std::operator<<(poVar7,"is not in the range [");
              poVar7 = std::operator<<(poVar7,psVar15);
              poVar7 = std::operator<<(poVar7,",");
              poVar7 = std::operator<<(poVar7,psVar15 + 0x20);
              poVar7 = std::operator<<(poVar7,"]");
              std::endl<char,std::char_traits<char>>(poVar7);
              bVar1 = false;
            }
          }
        }
      }
      if (((byte)local_270 & bVar1) == 0) goto LAB_00119510;
      ExportGAD(this,true);
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"Not enough parameters for ");
    poVar7 = std::operator<<(poVar7,(string *)
                                    ((this->m_OptionVector).
                                     super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>
                                     ._M_impl.super__Vector_impl_data._M_start + local_2a8));
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"Command: ");
    poVar7 = std::operator<<(poVar7,*argv);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"Options: ");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"  -v or -h for help listed in short format");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"  -V or -H for help listed in long format");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"  -vxml for help listed in xml format");
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"  -export-gad to export Grid Application");
    poVar7 = std::operator<<(poVar7,"Description file format");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
LAB_0011950d:
  bVar1 = false;
LAB_00119510:
  std::__cxx11::string::~string((string *)&completeString);
  std::__cxx11::string::~string((string *)&tag);
  return bVar1;
}

Assistant:

bool MetaCommand::Parse(int argc, const char* argv[])
{
  m_ExecutableName = argv[0];

  size_t slash = m_ExecutableName.find_last_of("/");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }
  slash = m_ExecutableName.find_last_of("\\");
  if(slash>0)
    {
    m_ExecutableName = m_ExecutableName.substr(slash+1,m_ExecutableName.size()-slash-1);
    }

  // List the options if using -V
  if((argc == 2 && !strcmp(argv[1],"-V"))
     || (argc == 2 && !strcmp(argv[1],"-H")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptions();
    return false;
    }
  // List the options if using -v
  else if((argc == 2 && !strcmp(argv[1],"-v"))
          || (argc == 2 && !strcmp(argv[1],"-h")))
    {
    METAIO_STREAM::cout << "Usage : " << argv[0] << METAIO_STREAM::endl;
    this->ListOptionsSimplified();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-vxml"))
    {
    this->ListOptionsXML();
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-version"))
    {
    METAIO_STREAM::cout << "Version: " << m_Version.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-date"))
    {
    METAIO_STREAM::cout << "Date: " << m_Date.c_str() << METAIO_STREAM::endl;
    return false;
    }
  else if(argc == 2 && !strcmp(argv[1],"-exportGAD"))
    {
    this->ExportGAD();
    return false;
    }

  // Fill in the results
  m_ParsedOptionVector.clear();
  bool inArgument = false;
  METAIO_STL::string tag = "";

  long currentField = 0; // current field position
  long currentOption = 0; // id of the option to fill
  size_t valuesRemaining=0;
  bool isComplete = false; // check if the option should be parse until the next tag is found
  METAIO_STL::string completeString = "";

  bool exportGAD = false;

  for(unsigned int i=1; i<(unsigned int)argc; ++i)
    {
    // If we have the tag -export-gad
    if(!strcmp(argv[i],"-exportGAD"))
      {
      exportGAD = true;
      continue;
      }

    // If this is a tag
    if(argv[i][0] == '-' && (atof(argv[i])==0) && (strlen(argv[i])>1))
      {
      // if we have a tag before the expected values we throw an exception
      if(valuesRemaining != 0)
        {
        if(!isComplete)
          {
          METAIO_STREAM::cout << "Found tag before end of value list!" << METAIO_STREAM::endl;
          return false;
          }
        else
          {
          m_OptionVector[currentOption].fields[0].value = completeString;
          m_OptionVector[currentOption].fields[0].userDefined = true;
          m_OptionVector[currentOption].userDefined = true;
          m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
          }
        }
      inArgument = false;
      // New tag so we add the previous values to the tag
      tag = argv[i];

      // Check if the tag is in the list
      if(this->OptionExistsByMinusTag(tag))
        {
        inArgument = true;
        valuesRemaining = this->GetOptionByMinusTag(tag)->fields.size();
        currentOption = this->GetOptionId(this->GetOptionByMinusTag(tag));

        if(currentOption < 0)
          {
          METAIO_STREAM::cout << "Error processing tag " << tag.c_str()
                    << ".  Tag exists but cannot find its Id."
                    << METAIO_STREAM::endl;
          }
        else
          {
          isComplete = m_OptionVector[currentOption].complete;

          if(m_OptionVector[currentOption].fields[0].type == FLAG)
            {
            // the tag exists by default
            m_OptionVector[currentOption].fields[0].value = "true";
            valuesRemaining = 0;
            inArgument = false;
            }
          else if(m_OptionVector[currentOption].fields[0].type == LIST)
            {
            inArgument = true;
            unsigned int valuesInList = (int)atoi(argv[++i]);
            m_OptionVector[currentOption].fields[0].value = argv[i];
            valuesRemaining += valuesInList-1;
            char optName[255];
            for(unsigned int j=0; j<valuesInList; j++)
              {
              snprintf(optName, sizeof(optName), "%03u", j);
              this->AddOptionField( m_OptionVector[currentOption].name,
                                    optName, STRING );
              }
            }
          }
        }
      else if(m_Verbose)
        {
        METAIO_STREAM::cout << "The tag " << tag.c_str()
                  << " is not a valid argument : skipping this tag"
                  << METAIO_STREAM::endl;
        }
      if(inArgument)
        {
        ++i;
        }
      }
    else if(!inArgument) // If this is a field
      {
      // Look for the field to add
      auto it = m_OptionVector.begin();
      long pos = 0;
      bool found = false;
      while(it != m_OptionVector.end())
        {
        if ((pos >= currentField) && ((*it).tag.empty())) {
          currentOption = pos;
          valuesRemaining = static_cast<unsigned int>((*it).fields.size());
          found = true;
          break;
        }
        ++pos;
        ++it;
        }

      if(!found && m_Verbose)
        {
        METAIO_STREAM::cout << "Too many arguments specified in your command line! "
                  << "Skipping extra argument: " << argv[i] << METAIO_STREAM::endl;
        }

      inArgument=true;
      currentField=currentOption+1;
      }

    // We collect the values
    if(isComplete)
      {
      if (completeString.empty()) {
        completeString = argv[i];
      } else {
        completeString += " ";
        completeString += argv[i];
      }
      }
    else if(inArgument && i<(unsigned int)argc && valuesRemaining>0)
      {
      if(currentOption >=0 && currentOption < (int)(m_OptionVector.size()))
        {
        auto s = static_cast<unsigned long>(
            m_OptionVector[currentOption].fields.size());
        m_OptionVector[currentOption].fields[s-valuesRemaining].value = argv[i];
        m_OptionVector[currentOption].fields[s-valuesRemaining].userDefined =
                                                                           true;
        }
      --valuesRemaining;
      }

    if(valuesRemaining == 0)
      {
      inArgument = false;
      m_OptionVector[currentOption].userDefined = true;
      m_ParsedOptionVector.push_back(m_OptionVector[currentOption]);
      }
    }

  if(valuesRemaining > 0)
    {
    METAIO_STREAM::cout << "Not enough parameters for "
              << m_OptionVector[currentOption].name << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;

    return false;
    }

  // Check if the options with required arguments are defined
    auto it = m_OptionVector.begin();
    bool requiredAndNotDefined = false;
    while (it != m_OptionVector.end()) {
      if ((*it).required) {
        // First check if the option is actually defined
        if (!(*it).userDefined) {
          METAIO_STREAM::cout << "Option " << (*it).name
                              << " is required but not defined"
                              << METAIO_STREAM::endl;
          requiredAndNotDefined = true;
          ++it;
          continue;
        }

      // Check if the values are defined
      METAIO_STL::vector<Field>::const_iterator itFields = (*it).fields.begin();
      bool defined = true;
      while(itFields != (*it).fields.end())
        {
        if ((*itFields).value.empty()) {
          defined = false;
        }
        ++itFields;
        }

      if(!defined)
        {
        if (!(*it).tag.empty()) {
          METAIO_STREAM::cout << "Field " << (*it).tag.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        } else {
          METAIO_STREAM::cout << "Field " << (*it).name.c_str()
                    << " is required but not defined" << METAIO_STREAM::endl;
        }
        requiredAndNotDefined = true;
        }
      }
    ++it;
    }

  if(requiredAndNotDefined)
    {
    METAIO_STREAM::cout << "Command: " << argv[0] << METAIO_STREAM::endl
              << "Options: " << METAIO_STREAM::endl
              << "  -v or -h for help listed in short format" << METAIO_STREAM::endl
              << "  -V or -H for help listed in long format" << METAIO_STREAM::endl
              << "  -vxml for help listed in xml format" << METAIO_STREAM::endl
              << "  -export-gad to export Grid Application"
              << "Description file format" << METAIO_STREAM::endl;
    return false;
    }

  // Check if the values are in range (if the range is defined)
    auto itParsed = m_ParsedOptionVector.begin();
    bool valueInRange = true;
    while (itParsed != m_ParsedOptionVector.end()) {
      METAIO_STL::vector<Field>::const_iterator itFields =
          (*itParsed).fields.begin();
      while (itFields != (*itParsed).fields.end()) {
        // Check only if this is a number
        if (((*itFields).type == INT || (*itFields).type == FLOAT ||
             (*itFields).type == CHAR) &&
            (!(*itFields).value.empty())) {
          // Check the range min
          if (((!(*itFields).rangeMin.empty()) &&
               (atof((*itFields).rangeMin.c_str()) >
                atof((*itFields).value.c_str()))) ||
              ((!(*itFields).rangeMax.empty()) &&
               (atof((*itFields).rangeMax.c_str()) <
                atof((*itFields).value.c_str())))) {
            METAIO_STREAM::cout
                << (*itParsed).name << "." << (*itFields).name << " : Value ("
                << (*itFields).value << ") "
                << "is not in the range [" << (*itFields).rangeMin << ","
                << (*itFields).rangeMax << "]" << METAIO_STREAM::endl;
            valueInRange = false;
          }
        }
        ++itFields;
      }
    ++itParsed;
    }

  if(!valueInRange)
    {
    return false;
    }

  // If everything is ok
  if(exportGAD)
    {
    this->ExportGAD(true);
    return false; // prevent from running the application
    }

  return true;
}